

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordManager.cpp
# Opt level: O0

void __thiscall
RecordManager::LoadAllRecordSet
          (RecordManager *this,vector<TableInfo,_std::allocator<TableInfo>_> *Ts)

{
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RecordSet>
  local_248;
  string local_1c8 [32];
  undefined1 local_1a8 [8];
  RecordSet NewRS;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118 [8];
  string filename;
  undefined1 local_f8 [8];
  TableInfo T;
  int i;
  vector<TableInfo,_std::allocator<TableInfo>_> *Ts_local;
  RecordManager *this_local;
  
  T._212_4_ = 0;
  while( true ) {
    uVar1 = (ulong)(int)T._212_4_;
    sVar2 = std::vector<TableInfo,_std::allocator<TableInfo>_>::size(Ts);
    if (sVar2 <= uVar1) break;
    pvVar3 = std::vector<TableInfo,_std::allocator<TableInfo>_>::at(Ts,(long)(int)T._212_4_);
    TableInfo::TableInfo((TableInfo *)local_f8,pvVar3);
    std::operator+(local_138,&this->Direction);
    std::operator+(local_118,(char *)local_138);
    std::__cxx11::string::~string((string *)local_138);
    std::__cxx11::string::string(local_1c8,(string *)local_118);
    RecordSet::RecordSet((RecordSet *)local_1a8,(string *)local_1c8);
    std::__cxx11::string::~string(local_1c8);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RecordSet>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_RecordSet_&,_true>
              (&local_248,local_118,(RecordSet *)local_1a8);
    std::
    map<std::__cxx11::string,RecordSet,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,RecordSet>>>
    ::insert<std::pair<std::__cxx11::string,RecordSet>>
              ((map<std::__cxx11::string,RecordSet,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,RecordSet>>>
                *)&this->Total_Record,&local_248);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RecordSet>
    ::~pair(&local_248);
    RecordSet::~RecordSet((RecordSet *)local_1a8);
    std::__cxx11::string::~string((string *)local_118);
    TableInfo::~TableInfo((TableInfo *)local_f8);
    T._212_4_ = T._212_4_ + 1;
  }
  return;
}

Assistant:

void RecordManager::LoadAllRecordSet(vector<TableInfo> Ts) {
	int i;
	for (i = 0; i < Ts.size(); i++) {
		TableInfo T = Ts.at(i);
		string filename = Direction + T.tableName + "_rcd.dat";
		RecordSet NewRS = RecordSet(filename);
		this->Total_Record.insert(pair<string, RecordSet>(filename, NewRS));
	}
}